

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O1

pair<QPDFObjectHandle,_bool> *
QPDFParser::parse(pair<QPDFObjectHandle,_bool> *__return_storage_ptr__,InputSource *input,
                 string *object_description,Tokenizer *tokenizer,StringDecrypter *decrypter,
                 QPDF *context)

{
  pair<QPDFObjectHandle,_bool> *ppVar1;
  int iVar2;
  undefined4 extraout_var;
  bool empty;
  QPDFObjectHandle result;
  bool local_101;
  pair<QPDFObjectHandle,_bool> *local_100;
  undefined1 local_f8 [24];
  pointer pSStack_e0;
  InputSource *local_d8;
  string *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  StringDecrypter *local_c0;
  QPDF *local_b8;
  pointer local_b0;
  pointer pSStack_a8;
  undefined1 local_a0;
  undefined8 local_9c;
  vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_> local_90;
  undefined8 uStack_78;
  undefined4 local_70;
  longlong local_6c;
  qpdf_offset_t local_60;
  undefined4 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_101 = false;
  local_100 = __return_storage_ptr__;
  iVar2 = (*input->_vptr_InputSource[3])(input);
  make_description((QPDFParser *)(local_f8 + 0x10),(string *)CONCAT44(extraout_var,iVar2),
                   object_description);
  local_b0 = (pointer)local_f8._16_8_;
  pSStack_a8 = pSStack_e0;
  local_f8._16_8_ = (Tokenizer *)0x0;
  pSStack_e0 = (pointer)0x0;
  local_a0 = 1;
  local_9c = 0;
  local_90.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_78._0_4_ = 0;
  uStack_78._4_4_ = 0;
  local_70 = 0;
  local_6c = 0xf;
  local_60 = 0;
  local_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_d8 = input;
  local_d0 = object_description;
  local_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)tokenizer;
  local_c0 = decrypter;
  local_b8 = context;
  parse((QPDFParser *)local_f8,(bool *)&local_d8,SUB81(&local_101,0));
  std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::~vector(&local_90);
  if (pSStack_a8 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSStack_a8);
  }
  ppVar1 = local_100;
  if (pSStack_e0 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSStack_e0);
  }
  (ppVar1->first).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_f8._0_8_;
  (ppVar1->first).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
  if ((string *)local_f8._8_8_ != (string *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_f8._8_8_ + 8) = (int)*(size_type *)(local_f8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_f8._8_8_ + 8) = (int)*(size_type *)(local_f8._8_8_ + 8) + 1;
    }
  }
  ppVar1->second = local_101;
  if ((string *)local_f8._8_8_ != (string *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  return ppVar1;
}

Assistant:

std::pair<QPDFObjectHandle, bool>
QPDFParser::parse(
    InputSource& input,
    std::string const& object_description,
    qpdf::Tokenizer& tokenizer,
    QPDFObjectHandle::StringDecrypter* decrypter,
    QPDF& context)
{
    bool empty{false};
    auto result = QPDFParser(
                      input,
                      make_description(input.getName(), object_description),
                      object_description,
                      tokenizer,
                      decrypter,
                      &context,
                      true)
                      .parse(empty, false);
    return {result, empty};
}